

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binning.cpp
# Opt level: O0

interval_t duckdb::MakeIntervalNice(interval_t interval)

{
  interval_t iVar1;
  long in_RSI;
  ulong in_RDI;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_28._0_4_ = (int)in_RDI;
  if ((int)local_28 < 6) {
    local_28 = in_RDI;
    if (((int)local_28 < 1) && (local_28._4_4_ = (int)(in_RDI >> 0x20), local_28._4_4_ < 5)) {
      if ((local_28._4_4_ < 1) && (in_RSI < 21600000000)) {
        if (in_RSI < 3600000000) {
          if (in_RSI < 600000000) {
            if (in_RSI < 60000000) {
              uStack_20 = in_RSI;
              if (9999999 < in_RSI) {
                uStack_20 = RoundNumberToDivisor(in_RSI,1000000);
              }
            }
            else {
              uStack_20 = RoundNumberToDivisor(in_RSI,15000000);
            }
          }
          else {
            uStack_20 = RoundNumberToDivisor(in_RSI,60000000);
          }
        }
        else {
          uStack_20 = RoundNumberToDivisor(in_RSI,900000000);
        }
      }
      else {
        uStack_20 = RoundNumberToDivisor(in_RSI,3600000000);
      }
    }
    else {
      uStack_20 = 0;
    }
  }
  else {
    local_28 = in_RDI & 0xffffffff;
    uStack_20 = 0;
  }
  iVar1.micros = uStack_20;
  iVar1.months = (int)local_28;
  iVar1.days = local_28._4_4_;
  return iVar1;
}

Assistant:

interval_t MakeIntervalNice(interval_t interval) {
	if (interval.months >= 6) {
		// if we have more than 6 months, we don't care about days
		interval.days = 0;
		interval.micros = 0;
	} else if (interval.months > 0 || interval.days >= 5) {
		// if we have any months or more than 5 days, we don't care about micros
		interval.micros = 0;
	} else if (interval.days > 0 || interval.micros >= 6 * Interval::MICROS_PER_HOUR) {
		// if we any days or more than 6 hours, we want micros to be roundable by hours at least
		interval.micros = RoundNumberToDivisor(interval.micros, Interval::MICROS_PER_HOUR);
	} else if (interval.micros >= Interval::MICROS_PER_HOUR) {
		// if we have more than an hour, we want micros to be divisible by quarter hours
		interval.micros = RoundNumberToDivisor(interval.micros, Interval::MICROS_PER_MINUTE * 15);
	} else if (interval.micros >= Interval::MICROS_PER_MINUTE * 10) {
		// if we have more than 10 minutes, we want micros to be divisible by minutes
		interval.micros = RoundNumberToDivisor(interval.micros, Interval::MICROS_PER_MINUTE);
	} else if (interval.micros >= Interval::MICROS_PER_MINUTE) {
		// if we have more than a minute, we want micros to be divisible by quarter minutes
		interval.micros = RoundNumberToDivisor(interval.micros, Interval::MICROS_PER_SEC * 15);
	} else if (interval.micros >= Interval::MICROS_PER_SEC * 10) {
		// if we have more than 10 seconds, we want micros to be divisible by seconds
		interval.micros = RoundNumberToDivisor(interval.micros, Interval::MICROS_PER_SEC);
	}
	return interval;
}